

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O0

void __thiscall
omp_reversed_reference_case_increase_values_Test::TestBody
          (omp_reversed_reference_case_increase_values_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  char *message;
  char *in_R9;
  string local_148;
  AssertHelper local_128;
  Message local_120;
  _List_node_base *local_118;
  _List_const_iterator<int> local_110;
  reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&> local_108;
  reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&> local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  int *v;
  reverse_iterator __end1;
  reverse_iterator __begin1;
  reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&> *__range1;
  int local_b8 [6];
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  list<int,_std::allocator<int>_> expecting;
  reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&> reversed_values;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  list<int,_std::allocator<int>_> values;
  omp_reversed_reference_case_increase_values_Test *this_local;
  
  local_58[0] = 1;
  local_58[1] = 4;
  local_58[2] = 3;
  local_58[3] = 2;
  local_58[4] = 5;
  local_38 = local_58;
  local_30 = 5;
  values.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = (size_t)this;
  std::allocator<int>::allocator(&local_59);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)local_28,__l_00,&local_59);
  std::allocator<int>::~allocator(&local_59);
  expecting.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size =
       (size_t)omp::reversed<std::__cxx11::list<int,std::allocator<int>>&>
                         ((list<int,_std::allocator<int>_> *)local_28);
  local_b8[0] = 6;
  local_b8[1] = 3;
  local_b8[2] = 4;
  local_b8[3] = 5;
  local_b8[4] = 2;
  local_a0 = local_b8;
  local_98 = 5;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 7));
  __l._M_len = local_98;
  __l._M_array = local_a0;
  std::__cxx11::list<int,_std::allocator<int>_>::list
            ((list<int,_std::allocator<int>_> *)local_90,__l,(allocator<int> *)((long)&__range1 + 7)
            );
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 7));
  omp::details::reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&>::begin
            ((reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&> *)&__end1)
  ;
  omp::details::reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&>::end
            ((reversed_container_adapter<std::__cxx11::list<int,_std::allocator<int>_>_&> *)&v);
  while (bVar1 = std::operator!=(&__end1,(reverse_iterator<std::_List_iterator<int>_> *)&v), bVar1)
  {
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::reverse_iterator<std::_List_iterator<int>_>::operator*(&__end1);
    *(int *)gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
         *(int *)gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl + 1;
    std::reverse_iterator<std::_List_iterator<int>_>::operator++(&__end1);
  }
  std::
  cbegin<omp::details::reversed_container_adapter<std::__cxx11::list<int,std::allocator<int>>&>>
            (&local_100);
  std::cend<omp::details::reversed_container_adapter<std::__cxx11::list<int,std::allocator<int>>&>>
            (&local_108);
  local_110._M_node =
       (_List_node_base *)
       std::cbegin<std::__cxx11::list<int,std::allocator<int>>>
                 ((list<int,_std::allocator<int>_> *)local_90);
  local_118 = (_List_node_base *)
              std::cend<std::__cxx11::list<int,std::allocator<int>>>
                        ((list<int,_std::allocator<int>_> *)local_90);
  local_f1 = std::
             equal<std::reverse_iterator<std::_List_iterator<int>>,std::_List_const_iterator<int>>
                       ((reverse_iterator<std::_List_iterator<int>_> *)&local_100,
                        (reverse_iterator<std::_List_iterator<int>_> *)&local_108,local_110,
                        (_List_const_iterator<int>)local_118);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_148,(internal *)local_f0,
               (AssertionResult *)
               "std::equal(std::cbegin(reversed_values), std::cend(reversed_values), std::cbegin(expecting), std::cend(expecting))"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/reversed_tests.cpp"
               ,0x44,message);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_90);
  std::__cxx11::list<int,_std::allocator<int>_>::~list((list<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(omp_reversed, reference_case_increase_values) {
  std::list values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(values);

  std::list expecting = {6, 3, 4, 5, 2};

  for (auto &v : reversed_values)
    ++v;

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}